

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.c
# Opt level: O1

void draw_player(int r,int g,int b,_func_int_float_ptr_int_ptr_int *project)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  ALLEGRO_COLOR AVar4;
  float shape [12];
  int ishape [12];
  float local_98 [3];
  undefined4 local_8c;
  float local_88;
  undefined4 local_84;
  float local_80;
  undefined4 local_7c;
  float local_78;
  undefined4 local_74;
  float local_70;
  undefined4 local_6c;
  int local_68 [14];
  
  piVar2 = ganja;
  lVar3 = 0;
  do {
    if (*piVar2 != 0) {
      local_98[0] = (float)(int)lVar3 * 0.0625;
      local_98[1] = 0.98;
      local_98[2] = (float)((int)lVar3 + 1) * 0.0625;
      local_8c = 0x3f7ae148;
      local_84 = 0x3f800000;
      local_7c = 0x3f800000;
      local_88 = local_98[2];
      local_80 = local_98[0];
      iVar1 = (*project)(local_98,local_68,8);
      if (iVar1 != 0) {
        AVar4 = makecol(r / 3,g / 3,b / 3);
        polygon(4,local_68,AVar4);
      }
    }
    lVar3 = lVar3 + 1;
    piVar2 = piVar2 + 1;
  } while (lVar3 != 0x10);
  if ((init_time & 4U) == 0 && die_time == 0) {
    local_98[0] = pos + -0.04;
    local_98[2] = pos + -0.02;
    local_98[1] = 0.98;
    local_8c = 0x3f7851ec;
    local_88 = pos;
    local_84 = 0x3f733333;
    local_80 = pos + 0.02;
    local_7c = 0x3f7851ec;
    local_78 = pos + 0.04;
    local_74 = 0x3f7ae148;
    local_70 = pos;
    local_6c = 0x3f7ae148;
    iVar1 = (*project)(local_98,local_68,0xc);
    if (iVar1 != 0) {
      AVar4 = makecol(r,g,b);
      polygon(6,local_68,AVar4);
    }
  }
  return;
}

Assistant:

void draw_player(int r, int g, int b, int (*project)(float *f, int *i, int c))
{
   float shape[12];
   int ishape[12];
   int i;

   /* draw health segments */
   for (i=0; i<SEGMENTS; i++) {
      if (ganja[i]) {
	 shape[0] = (float)i / SEGMENTS;
	 shape[1] = 0.98;

	 shape[2] = (float)(i+1) / SEGMENTS;
	 shape[3] = 0.98;

	 shape[4] = (float)(i+1) / SEGMENTS;
	 shape[5] = 1.0;

	 shape[6] = (float)i / SEGMENTS;
	 shape[7] = 1.0;

	 if (project(shape, ishape, 8))
	    polygon(4, ishape, makecol(r/3, g/3, b/3));
      }
   }

   /* flash on and off while initing, don't show while dead */
   if ((init_time & 4) || (die_time))
      return;

   /* draw the ship */
   shape[0] = pos - 0.04;
   shape[1] = 0.98;

   shape[2] = pos - 0.02;
   shape[3] = 0.97;

   shape[4] = pos;
   shape[5] = 0.95;

   shape[6] = pos + 0.02;
   shape[7] = 0.97;

   shape[8] = pos + 0.04;
   shape[9] = 0.98;

   shape[10] = pos;
   shape[11] = 0.98;

   if (project(shape, ishape, 12))
      polygon(6, ishape, makecol(r, g, b));
}